

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.cpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanSyncObjectManager::~VulkanSyncObjectManager(VulkanSyncObjectManager *this)

{
  pointer ppVVar1;
  pointer ppVVar2;
  pointer ppVVar3;
  pointer ppVVar4;
  
  std::mutex::lock(&this->m_SemaphorePoolGuard);
  ppVVar1 = (this->m_SemaphorePool).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppVVar3 = (this->m_SemaphorePool).
                 super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppVVar3 != ppVVar1; ppVVar3 = ppVVar3 + 1) {
    (*vkDestroySemaphore)(this->m_LogicalDevice->m_VkDevice,*ppVVar3,(VkAllocationCallbacks *)0x0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_SemaphorePoolGuard);
  std::mutex::lock(&this->m_FencePoolGuard);
  ppVVar2 = (this->m_FencePool).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppVVar4 = (this->m_FencePool).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppVVar4 != ppVVar2; ppVVar4 = ppVVar4 + 1
      ) {
    (*vkDestroyFence)(this->m_LogicalDevice->m_VkDevice,*ppVVar4,(VkAllocationCallbacks *)0x0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_FencePoolGuard);
  std::_Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>::~_Vector_base
            (&(this->m_FencePool).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>);
  std::_Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::~_Vector_base
            (&(this->m_SemaphorePool).
              super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<VulkanUtilities::VulkanSyncObjectManager>).
              _M_weak_this.
              super___weak_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

VulkanSyncObjectManager::~VulkanSyncObjectManager()
{
    {
        std::lock_guard<std::mutex> Lock{m_SemaphorePoolGuard};

        for (auto vkSem : m_SemaphorePool)
        {
            vkDestroySemaphore(m_LogicalDevice.GetVkDevice(), vkSem, nullptr);
        }
    }
    {
        std::lock_guard<std::mutex> Lock{m_FencePoolGuard};

        for (auto vkFence : m_FencePool)
        {
            vkDestroyFence(m_LogicalDevice.GetVkDevice(), vkFence, nullptr);
        }
    }
}